

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool ON_String::EqualPath(char *path1,int element_count1,char *path2,int element_count2)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  char null_terminator;
  uint local_40;
  uint local_3c;
  char *local_38;
  
  bVar1 = path2 == (char *)0x0;
  if ((path1 != (char *)0x0 || element_count1 == 0) &&
     (bVar1 = path1 == (char *)0x0, path2 != (char *)0x0 || element_count2 == 0)) {
    null_terminator = '\0';
    if (element_count1 < 0) {
      element_count1 = Length(path1);
    }
    if (element_count2 < 0) {
      element_count2 = Length(path2);
    }
    if (element_count1 == 0) {
      path1 = &null_terminator;
    }
    if (element_count2 == 0) {
      path2 = &null_terminator;
    }
    bVar1 = true;
    if (element_count1 != element_count2 || path1 != path2) {
      local_40 = element_count2;
      local_3c = element_count1;
      if (element_count1 < element_count2) {
        element_count2 = element_count1;
      }
      uVar5 = 0;
      uVar6 = (ulong)(uint)element_count2;
      if (element_count2 < 1) {
        uVar6 = uVar5;
      }
      local_38 = path2 + uVar6;
      for (; (int)uVar6 != (int)uVar5; uVar5 = uVar5 + 1) {
        uVar2 = OrdinalUTF8ToIgnoreCase(path1[uVar5]);
        cVar4 = '/';
        if ((char)uVar2 != '\\') {
          cVar4 = (char)uVar2;
        }
        uVar2 = OrdinalUTF8ToIgnoreCase(path2[uVar5]);
        cVar3 = '/';
        if ((char)uVar2 != '\\') {
          cVar3 = (char)uVar2;
        }
        if (cVar4 != cVar3) {
          return false;
        }
      }
      uVar2 = 0;
      if (0 < (int)local_3c) {
        uVar2 = local_3c;
      }
      for (; (int)uVar6 < (int)local_3c; uVar6 = uVar6 + 1) {
        if (path1[uVar6] != '\0') {
          return false;
        }
      }
      for (; (bVar1 = (int)local_40 <= (int)uVar2, (int)uVar2 < (int)local_40 && (*local_38 == '\0')
             ); local_38 = local_38 + 1) {
        uVar2 = uVar2 + 1;
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_String::EqualPath(
  const char* path1,
  int element_count1,
  const char* path2,
  int element_count2
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(path1,element_count1,path2,element_count2);

  unsigned int c1=0, c2=0;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;
  int i;
  const bool bOrdinalIgnoreCase = ON_FileSystemPath::PlatformPathIgnoreCase();

  if (bOrdinalIgnoreCase)
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeUTF8PathSepartor((char)OrdinalUTF8ToIgnoreCase(*path1++));
      c2 = ON_NormalizeUTF8PathSepartor((char)OrdinalUTF8ToIgnoreCase(*path2++));
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeUTF8PathSepartor(*path1++);
      c2 = ON_NormalizeUTF8PathSepartor(*path2++);
      if ( c1 != c2 )
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*path1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*path2++))
      return false;
  }

  return true;
}